

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syms.c
# Opt level: O2

void syms_dump_e(FILE *f,symtbl_t *t)

{
  sym_t *psVar1;
  char *pcVar2;
  char *pcVar3;
  ulong uVar4;
  
  if (t->num_syms != 0) {
    fwrite(";-------------------------------------------------------------------------------\n",0x51
           ,1,(FILE *)f);
  }
  for (uVar4 = 0; uVar4 < t->num_syms; uVar4 = uVar4 + 1) {
    psVar1 = t->syms[uVar4];
    pcVar2 = token_name(psVar1->type_id);
    pcVar3 = "YES";
    if (psVar1->function == 0) {
      pcVar3 = "";
    }
    fprintf((FILE *)f,"; %-31s %-9s %-5s %-6d\n",psVar1,pcVar2,pcVar3,(ulong)(uint)t->scope_id);
  }
  for (uVar4 = 0; uVar4 < t->num_children; uVar4 = uVar4 + 1) {
    if (t->children[uVar4] != (symtbl_t *)0x0) {
      syms_dump_e(f,t->children[uVar4]);
    }
  }
  return;
}

Assistant:

void syms_dump_e(FILE* f, symtbl_t* t)
{
    unsigned int i;
    if (t->num_syms)
        fprintf(f, ";-------------------------------------------------------------------------------\n");
    for (i = 0; i < t->num_syms; i++)
    {
        sym_t* s = t->syms[i];
        fprintf(f, "; %-31s %-9s %-5s %-6d\n", s->id, token_name(s->type_id), s->function ? "YES" : "", t->scope_id);
    }

    for (i = 0; i < t->num_children; i++)
    {
        if (t->children[i])
            syms_dump_e(f, t->children[i]);
    }
}